

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O3

float32 floatx80_to_float32_mipsel(floatx80 a,float_status *status)

{
  ulong uVar1;
  float32 fVar2;
  ushort uVar3;
  ulong uVar4;
  int zExp;
  int iVar5;
  floatx80 a_00;
  commonNaNT local_20;
  
  uVar4 = a.low;
  a_00._8_8_ = a._8_8_ & 0xffffffff;
  uVar3 = (ushort)a_00._8_8_ & 0x7fff;
  if (((undefined1  [16])a & (undefined1  [16])0x7fff) == (undefined1  [16])0x0 || (long)uVar4 < 0)
  {
    uVar1 = (a._8_8_ & 0xffff) >> 0xf;
    if (uVar3 != 0x7fff) {
      uVar4 = (ulong)(((undefined1  [16])a & (undefined1  [16])0x1ffffffff) != (undefined1  [16])0x0
                     ) | uVar4 >> 0x21;
      iVar5 = uVar3 - 0x3f81;
      zExp = 0;
      if (uVar4 != 0) {
        zExp = iVar5;
      }
      if (((undefined1  [16])a & (undefined1  [16])0x7fff) != (undefined1  [16])0x0) {
        zExp = iVar5;
      }
      fVar2 = roundAndPackFloat32((flag)uVar1,zExp,(uint32_t)uVar4,status);
      return fVar2;
    }
    if (((undefined1  [16])a & (undefined1  [16])0x7fffffffffffffff) == (undefined1  [16])0x0) {
      return (int)uVar1 << 0x1f | 0x7f800000;
    }
    a_00.low = uVar4;
    floatx80ToCommonNaN(&local_20,a_00,status);
    if ((status->default_nan_mode == '\0') && (local_20.high >> 0x29 != 0)) {
      return (uint)(local_20.high >> 0x29) + (uint)local_20.sign * -0x80000000 + 0x7f800000;
    }
  }
  else {
    status->float_exception_flags = status->float_exception_flags | 1;
  }
  return (status->snan_bit_is_one == '\0') + 0x7fbfffff;
}

Assistant:

float32 floatx80_to_float32(floatx80 a, float_status *status)
{
    flag aSign;
    int32_t aExp;
    uint64_t aSig;

    if (floatx80_invalid_encoding(a)) {
        float_raise(float_flag_invalid, status);
        return float32_default_nan(status);
    }
    aSig = extractFloatx80Frac( a );
    aExp = extractFloatx80Exp( a );
    aSign = extractFloatx80Sign( a );
    if ( aExp == 0x7FFF ) {
        if ( (uint64_t) ( aSig<<1 ) ) {
            return commonNaNToFloat32(floatx80ToCommonNaN(a, status), status);
        }
        return packFloat32( aSign, 0xFF, 0 );
    }
    shift64RightJamming( aSig, 33, &aSig );
    if ( aExp || aSig ) aExp -= 0x3F81;
    return roundAndPackFloat32(aSign, aExp, aSig, status);

}